

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

bool __thiscall
MidiInApi::MidiQueue::pop
          (MidiQueue *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *msg,
          double *timeStamp)

{
  double *this_00;
  uint uVar1;
  iterator __first;
  iterator __last;
  uint local_30;
  uint _size;
  uint _front;
  uint _back;
  double *timeStamp_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *msg_local;
  MidiQueue *this_local;
  
  __front = timeStamp;
  timeStamp_local = (double *)msg;
  msg_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  uVar1 = size(this,&_size,&local_30);
  this_00 = timeStamp_local;
  if (uVar1 != 0) {
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        (&this->ring[local_30].bytes);
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       (&this->ring[local_30].bytes);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
    *__front = this->ring[local_30].timeStamp;
    this->front = (this->front + 1) % this->ringSize;
  }
  return uVar1 != 0;
}

Assistant:

bool MidiInApi::MidiQueue::pop( std::vector<unsigned char> *msg, double* timeStamp )
{
  // Local stack copies of front/back
  unsigned int _back, _front, _size;

  // Get back/front indexes exactly once and calculate current size
  _size = size( &_back, &_front );

  if ( _size == 0 )
    return false;

  // Copy queued message to the vector pointer argument and then "pop" it.
  msg->assign( ring[_front].bytes.begin(), ring[_front].bytes.end() );
  *timeStamp = ring[_front].timeStamp;

  // Update front
  front = (front+1)%ringSize;
  return true;
}